

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode curl_multi_perform(Curl_multi *multi,int *running_handles)

{
  CURLMcode CVar1;
  Curl_tree *pCVar2;
  Curl_easy *data;
  CURLMcode CVar3;
  timeval now;
  Curl_tree *t;
  anon_union_8_2_5ad2d23e_for___sigaction_handler local_d0 [19];
  char local_38;
  
  now = curlx_tvnow();
  CVar3 = CURLM_BAD_HANDLE;
  if ((multi != (Curl_multi *)0x0) && (multi->type == 0xbab1e)) {
    data = multi->easyp;
    if (data == (Curl_easy *)0x0) {
      CVar3 = CURLM_OK;
    }
    else {
      CVar3 = CURLM_OK;
      do {
        sigpipe_ignore(data,(sigpipe_ignore *)local_d0);
        CVar1 = multi_runsingle(multi,now,data);
        if (local_38 == '\0') {
          sigaction(0xd,(sigaction *)local_d0,(sigaction *)0x0);
        }
        if (CVar1 != CURLM_OK) {
          CVar3 = CVar1;
        }
        data = data->next;
      } while (data != (Curl_easy *)0x0);
    }
    do {
      pCVar2 = Curl_splaygetbest(now,multi->timetree,(Curl_tree **)&local_d0[0].sa_handler);
      multi->timetree = pCVar2;
      if (local_d0[0].sa_handler != (__sighandler_t)0x0) {
        add_next_timeout(now,multi,*(Curl_easy **)(local_d0[0].sa_handler + 0x30));
      }
    } while (local_d0[0].sa_handler != (__sighandler_t)0x0);
    *running_handles = multi->num_alive;
    if (CVar3 < CURLM_BAD_HANDLE) {
      update_timer(multi);
    }
  }
  return CVar3;
}

Assistant:

CURLMcode curl_multi_perform(struct Curl_multi *multi, int *running_handles)
{
  struct Curl_easy *data;
  CURLMcode returncode=CURLM_OK;
  struct Curl_tree *t;
  struct timeval now = Curl_tvnow();

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  data=multi->easyp;
  while(data) {
    CURLMcode result;
    SIGPIPE_VARIABLE(pipe_st);

    sigpipe_ignore(data, &pipe_st);
    result = multi_runsingle(multi, now, data);
    sigpipe_restore(&pipe_st);

    if(result)
      returncode = result;

    data = data->next; /* operate on next handle */
  }

  /*
   * Simply remove all expired timers from the splay since handles are dealt
   * with unconditionally by this function and curl_multi_timeout() requires
   * that already passed/handled expire times are removed from the splay.
   *
   * It is important that the 'now' value is set at the entry of this function
   * and not for the current time as it may have ticked a little while since
   * then and then we risk this loop to remove timers that actually have not
   * been handled!
   */
  do {
    multi->timetree = Curl_splaygetbest(now, multi->timetree, &t);
    if(t)
      /* the removed may have another timeout in queue */
      (void)add_next_timeout(now, multi, t->payload);

  } while(t);

  *running_handles = multi->num_alive;

  if(CURLM_OK >= returncode)
    update_timer(multi);

  return returncode;
}